

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.cpp
# Opt level: O0

Complex __thiscall libDAI::TreeEP::logZ(TreeEP *this)

{
  bool bVar1;
  size_t sVar2;
  long *plVar3;
  TreeEP *pTVar4;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  long *in_RDI;
  double dVar5;
  Complex CVar6;
  TFactor<double> *unaff_retaddr;
  TFactor<double> *in_stack_00000008;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_stack_00000030;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_stack_00000038;
  TreeEPSubTree *in_stack_00000040;
  size_t I;
  size_t alpha_1;
  size_t alpha;
  size_t beta;
  double sum;
  map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
  *in_stack_fffffffffffffed8;
  RegionGraph *in_stack_fffffffffffffee0;
  TreeEP *this_00;
  TFactor<double> *in_stack_ffffffffffffff18;
  TreeEP *local_e0;
  ulong local_58;
  ulong local_40;
  ulong local_28;
  double local_20;
  complex<double> local_10;
  
  local_20 = 0.0;
  local_28 = 0;
  while( true ) {
    (**(code **)(*in_RDI + 0x20))();
    sVar2 = RegionGraph::nr_IRs((RegionGraph *)0xb9c925);
    if (sVar2 <= local_28) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x45),local_28);
    TFactor<double>::entropy((TFactor<double> *)0xb9c953);
    dVar5 = std::real<double>((complex<double> *)0xb9c972);
    local_20 = local_20 - dVar5;
    local_28 = local_28 + 1;
  }
  local_40 = 0;
  while( true ) {
    (**(code **)(*in_RDI + 0x20))();
    sVar2 = RegionGraph::nr_ORs((RegionGraph *)0xb9c9d1);
    if (sVar2 <= local_40) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x42),local_40);
    TFactor<double>::entropy((TFactor<double> *)0xb9c9ff);
    dVar5 = std::real<double>((complex<double> *)0xb9ca1e);
    local_20 = dVar5 + local_20;
    local_40 = local_40 + 1;
  }
  local_58 = 0;
  while( true ) {
    (**(code **)(*in_RDI + 0x20))();
    sVar2 = RegionGraph::nr_ORs((RegionGraph *)0xb9ca75);
    if (sVar2 <= local_58) break;
    (**(code **)(*in_RDI + 0x20))();
    RegionGraph::OR(in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8);
    TFactor<double>::log0(in_stack_ffffffffffffff18);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x42),local_58);
    TFactor<double>::operator*(in_stack_00000008,unaff_retaddr);
    dVar5 = TFactor<double>::totalSum((TFactor<double> *)0xb9caf3);
    local_20 = dVar5 + local_20;
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffee0);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffee0);
    local_58 = local_58 + 1;
  }
  local_e0 = (TreeEP *)0x0;
  while( true ) {
    this_00 = local_e0;
    plVar3 = (long *)(**(code **)(*in_RDI + 0x20))();
    pTVar4 = (TreeEP *)(**(code **)(*plVar3 + 0x48))();
    if (pTVar4 <= this_00) break;
    bVar1 = offtree(this_00,(size_t)in_stack_fffffffffffffed8);
    if (bVar1) {
      std::
      map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
      ::find(in_stack_fffffffffffffed8,(key_type *)0xb9cbe0);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>::
      operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>
                  *)0xb9cbef);
      dVar5 = TreeEPSubTree::logZ(in_stack_00000040,in_stack_00000038,in_stack_00000030);
      local_20 = dVar5 + local_20;
    }
    local_e0 = (TreeEP *)
               ((long)&(local_e0->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm.
                       _vptr_InferenceAlgorithm + 1);
  }
  std::complex<double>::complex(&local_10,local_20,0.0);
  CVar6._M_value._8_8_ = extraout_RDX;
  CVar6._M_value._0_8_ = extraout_RAX;
  return (Complex)CVar6._M_value;
}

Assistant:

Complex TreeEP::logZ() const {
        double sum = 0.0;

        // entropy of the tree
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            sum -= real(_Qb[beta].entropy());
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            sum += real(_Qa[alpha].entropy());

        // energy of the on-tree factors
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            sum += (grm().OR(alpha).log0() * _Qa[alpha]).totalSum();

        // energy of the off-tree factors
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            if( offtree(I) )
                sum += (_Q.find(I))->second.logZ( _Qa, _Qb );
        
        return sum;
    }